

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallFinalizableHeapBlock.cpp
# Opt level: O2

uint __thiscall
Memory::SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes>::CheckDisposedObjectFreeBitVector
          (SmallFinalizableHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  BOOLEAN BVar4;
  ushort uVar5;
  FreeObject *this_00;
  uint uVar6;
  undefined8 *in_FS_OFFSET;
  
  this_00 = this->disposedObjectList;
  if (this_00 == (FreeObject *)0x0) {
    return 0;
  }
  puVar1 = (undefined4 *)*in_FS_OFFSET;
  uVar6 = 1;
  do {
    uVar5 = SmallHeapBlockT<SmallAllocationBlockAttributes>::GetAddressBitIndex(this_00);
    bVar3 = SmallHeapBlockT<SmallAllocationBlockAttributes>::IsValidBitIndex
                      ((SmallHeapBlockT<SmallAllocationBlockAttributes> *)this,(uint)uVar5);
    if (!bVar3) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x279,"(this->IsValidBitIndex(bitIndex))",
                         "this->IsValidBitIndex(bitIndex)");
      if (!bVar3) goto LAB_002a959a;
      *puVar1 = 0;
    }
    BVar4 = BVStatic<256UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.debugFreeBits,
                       (uint)uVar5);
    if (BVar4 != '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27a,"(!this->GetDebugFreeBitVector()->Test(bitIndex))",
                         "!this->GetDebugFreeBitVector()->Test(bitIndex)");
      if (!bVar3) goto LAB_002a959a;
      *puVar1 = 0;
    }
    BVar4 = BVStatic<256UL>::Test
                      (&(this->super_SmallNormalHeapBlockT<SmallAllocationBlockAttributes>).
                        super_SmallHeapBlockT<SmallAllocationBlockAttributes>.freeBits,(uint)uVar5);
    if (BVar4 == '\0') {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar1 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/SmallFinalizableHeapBlock.cpp"
                         ,0x27b,"(free->Test(bitIndex))","free->Test(bitIndex)");
      if (!bVar3) {
LAB_002a959a:
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar1 = 0;
    }
    if (this_00 == this->disposedObjectListTail) {
      return uVar6;
    }
    this_00 = FreeObject::GetNext(this_00);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

uint
SmallFinalizableHeapBlockT<TBlockAttributes>::CheckDisposedObjectFreeBitVector()
{
    uint verifyFreeCount = 0;
    // all the finalized object are considered freed, but not allocable yet
    FreeObject *freeObject = this->disposedObjectList;
    if (freeObject != nullptr)
    {
        SmallHeapBlockBitVector * free = this->GetFreeBitVector();
        while (true)
        {
            uint bitIndex = this->GetAddressBitIndex(freeObject);
            Assert(this->IsValidBitIndex(bitIndex));
            Assert(!this->GetDebugFreeBitVector()->Test(bitIndex));
            Assert(free->Test(bitIndex));
            verifyFreeCount++;

            if (freeObject == this->disposedObjectListTail)
            {
                break;
            }
            freeObject = freeObject->GetNext();
        }
    }
    return verifyFreeCount;
}